

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactStateMachine.cpp
# Opt level: O0

void __thiscall
iDynTree::ContactStateMachine::ContactStateMachine(ContactStateMachine *this,SchmittParams *s)

{
  void *stableONTime;
  pointer pSVar1;
  unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_> *in_RDI;
  unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
  *lowValueThreshold;
  double in_stack_ffffffffffffffd8;
  SchmittTrigger *in_stack_ffffffffffffffe0;
  
  lowValueThreshold = in_RDI;
  std::unique_ptr<iDynTree::SchmittTrigger,std::default_delete<iDynTree::SchmittTrigger>>::
  unique_ptr<std::default_delete<iDynTree::SchmittTrigger>,void>(in_RDI);
  *(undefined1 *)
   &lowValueThreshold[1]._M_t.
    super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
    _M_t.
    super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
    .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl = 1;
  *(undefined1 *)
   ((long)&lowValueThreshold[1]._M_t.
           super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
           .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl + 1) = 1;
  stableONTime = operator_new(0x48);
  SchmittTrigger::SchmittTrigger
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(double)stableONTime,
             (double)lowValueThreshold,(double)in_RDI);
  pSVar1 = (pointer)&stack0xffffffffffffffe8;
  std::unique_ptr<iDynTree::SchmittTrigger,std::default_delete<iDynTree::SchmittTrigger>>::
  unique_ptr<std::default_delete<iDynTree::SchmittTrigger>,void>(in_RDI,pSVar1);
  std::unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::
  operator=(in_RDI,(unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
                    *)pSVar1);
  std::unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::
  ~unique_ptr(in_RDI);
  pSVar1 = std::unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
           ::get(in_RDI);
  SchmittTrigger::setInitialState
            (pSVar1,(bool)(*(byte *)&in_RDI[1]._M_t.
                                     super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
                                     .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>.
                                     _M_head_impl & 1));
  return;
}

Assistant:

ContactStateMachine::ContactStateMachine(const SchmittParams& s) : m_previousState(true), 
                                                                   m_currentState(true)                                                                   
{
    m_contactSchmitt = std::unique_ptr<SchmittTrigger>(new SchmittTrigger(s.stableTimeContactBreak, 
                                                                          s.stableTimeContactMake,
                                                                          s.contactBreakForceThreshold,
                                                                          s.contactMakeForceThreshold));
    m_contactSchmitt.get()->setInitialState(m_previousState);
}